

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_attention.h
# Opt level: O3

void __thiscall
shift_window_transformer::WindowAttention<float>::forward
          (WindowAttention<float> *this,Tensor<float> *input,Tensor<float> *output)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Tensor<float> *pTVar4;
  ulong uVar5;
  ulong uVar6;
  pointer pfVar7;
  ulong uVar8;
  pointer piVar9;
  pointer pfVar10;
  pointer pfVar11;
  int *piVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  int j;
  int iVar21;
  int j_1;
  long lVar22;
  long lVar23;
  pointer pfVar24;
  float fVar25;
  Tensor<float> dots;
  Tensor<float> tmp2;
  Tensor<float> tmp;
  Tensor<float> v;
  Tensor<float> q;
  Tensor<float> k;
  Tensor<float> vTmp;
  Tensor<float> kTmp;
  Tensor<float> tmp3;
  Tensor<float> tmp4;
  Tensor<float> qTmp;
  Tensor<float> attn;
  pointer local_2d0;
  long local_2c0;
  Tensor<float> local_298;
  long local_268;
  int local_25c;
  void *local_258;
  iterator iStack_250;
  float *local_248;
  vector<int,_std::allocator<int>_> vStack_240;
  void *local_228;
  undefined8 uStack_220;
  long local_218;
  void *pvStack_210;
  undefined8 local_208;
  long lStack_200;
  Tensor<float> local_1f8;
  Tensor<float> local_1c8;
  Tensor<float> local_198;
  Tensor<float> local_168;
  Tensor<float> local_138;
  vector<float,_std::allocator<float>_> local_108;
  vector<int,_std::allocator<int>_> vStack_f0;
  Tensor<float> *local_d8;
  long local_d0;
  void *local_c8;
  undefined8 uStack_c0;
  long local_b8;
  void *pvStack_b0;
  undefined8 local_a8;
  long lStack_a0;
  Tensor<float> local_98;
  Tensor<float> local_68;
  
  local_208 = 0;
  lStack_200 = 0;
  local_218 = 0;
  pvStack_210 = (void *)0x0;
  local_228 = (void *)0x0;
  uStack_220 = 0;
  if (this->shifted == true) {
    (*(code *)**(undefined8 **)this->cyclicShift)(this->cyclicShift,input,&local_228);
  }
  else {
    std::vector<float,std::allocator<float>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>>
              ((vector<float,std::allocator<float>> *)&local_228,0,
               (input->super_vector<float,_std::allocator<float>_>).
               super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_start,(input->super_vector<float,_std::allocator<float>_>).
                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish);
    std::vector<int,std::allocator<int>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
              ((vector<int,std::allocator<int>> *)&pvStack_210,local_208,
               (input->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (input->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  local_98.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (int *)0x0;
  local_98.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_98.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_138.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_138.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_138.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_138.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_138.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_138.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_168.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_168.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_168.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_168.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_168.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_168.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (**(this->qLinear->super_Layer<float>)._vptr_Layer)(this->qLinear,&local_228);
  (**(this->kLinear->super_Layer<float>)._vptr_Layer)(this->kLinear,&local_228,&local_138);
  (**(this->kLinear->super_Layer<float>)._vptr_Layer)(this->kLinear,&local_228,&local_168);
  local_1c8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1c8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1c8.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1c8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1c8.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_1c8.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_198.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_198.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_198.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_198.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_198.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_198.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_1f8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1f8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1f8.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1f8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1f8.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_1f8.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  iVar15 = *local_98.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start / this->windowSize;
  iVar17 = local_98.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[1] / this->windowSize;
  reArrange(this,&local_98,&local_1c8);
  reArrange(this,&local_138,&local_198);
  reArrange(this,&local_168,&local_1f8);
  local_298.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_298.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_298.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_298.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (int *)0x0;
  local_298.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_298.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (float *)0x0;
  uVar1 = local_1c8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish[-2];
  uVar2 = local_1c8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish[-1];
  local_d8 = output;
  std::vector<int,_std::allocator<int>_>::operator=(&local_298.shape,&local_1c8.shape);
  uVar8 = (ulong)uVar1;
  local_298.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish[-1] =
       local_298.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_finish[-2];
  local_268 = (long)(int)uVar1;
  local_25c = iVar15;
  if (local_1c8.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish !=
      local_1c8.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start) {
    local_d0 = (long)(int)(uVar2 * uVar1) * 4;
    local_2c0 = 0;
    uVar20 = 0;
    pfVar7 = local_1c8.super_vector<float,_std::allocator<float>_>.
             super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pfVar10 = local_1c8.super_vector<float,_std::allocator<float>_>.
              super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_finish;
    do {
      if (0 < (int)uVar1) {
        uVar6 = 0;
        lVar22 = local_2c0;
        do {
          uVar16 = 0;
          lVar23 = local_2c0;
          do {
            local_68.super_vector<float,_std::allocator<float>_>.
            super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)((ulong)local_68.super_vector<float,_std::allocator<float>_>.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_start & 0xffffffff00000000);
            if ((int)uVar2 < 1) {
              fVar25 = 0.0;
            }
            else {
              fVar25 = 0.0;
              uVar13 = 0;
              do {
                fVar25 = fVar25 + *(float *)((long)local_1c8.
                                                   super_vector<float,_std::allocator<float>_>.
                                                   super__Vector_base<float,_std::allocator<float>_>
                                                   ._M_impl.super__Vector_impl_data._M_start +
                                            uVar13 * 4 + lVar22) *
                                  *(float *)((long)local_198.
                                                   super_vector<float,_std::allocator<float>_>.
                                                   super__Vector_base<float,_std::allocator<float>_>
                                                   ._M_impl.super__Vector_impl_data._M_start +
                                            uVar13 * 4 + lVar23);
                local_68.super_vector<float,_std::allocator<float>_>.
                super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_start = (pointer)CONCAT44(local_68.super_vector<float,_std::allocator<float>_>.
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data._M_start._4_4_,fVar25);
                uVar13 = uVar13 + 1;
              } while (uVar2 != uVar13);
            }
            if (local_298.super_vector<float,_std::allocator<float>_>.
                super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_finish ==
                local_298.super_vector<float,_std::allocator<float>_>.
                super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)&local_298,
                         (iterator)
                         local_298.super_vector<float,_std::allocator<float>_>.
                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish,(float *)&local_68);
            }
            else {
              *local_298.super_vector<float,_std::allocator<float>_>.
               super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_finish = fVar25;
              local_298.super_vector<float,_std::allocator<float>_>.
              super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_finish = local_298.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_finish + 1;
            }
            uVar16 = uVar16 + 1;
            lVar23 = lVar23 + (long)(int)uVar2 * 4;
          } while (uVar16 != uVar8);
          uVar6 = uVar6 + 1;
          lVar22 = lVar22 + (long)(int)uVar2 * 4;
          pfVar7 = local_1c8.super_vector<float,_std::allocator<float>_>.
                   super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                   ._M_start;
          pfVar10 = local_1c8.super_vector<float,_std::allocator<float>_>.
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        } while (uVar6 != uVar8);
      }
      uVar20 = uVar20 + (long)(int)(uVar2 * uVar1);
      local_2c0 = local_2c0 + local_d0;
    } while (uVar20 < (ulong)((long)pfVar10 - (long)pfVar7 >> 2));
  }
  pfVar7 = (this->posEmbedding->super_vector<float,_std::allocator<float>_>).
           super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
           _M_start;
  uVar20 = (long)(this->posEmbedding->super_vector<float,_std::allocator<float>_>).
                 super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                 _M_finish - (long)pfVar7 >> 2;
  if (this->relativePosEmbedding == false) {
    if (uVar20 != uVar1 * uVar1) {
      __assert_fail("posEmbedding->size() == matX * matX",
                    "/workspace/llm4binary/github/license_c_cmakelists/dianhsu[P]swin-transformer-cpp/model/window_attention.h"
                    ,0x8b,
                    "virtual void shift_window_transformer::WindowAttention<float>::forward(const Tensor<T> &, Tensor<T> &) [T = float]"
                   );
    }
    if ((long)local_298.super_vector<float,_std::allocator<float>_>.
              super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)local_298.super_vector<float,_std::allocator<float>_>.
              super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start != 0) {
      uVar6 = 0;
      pfVar10 = local_298.super_vector<float,_std::allocator<float>_>.
                super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                _M_start;
      do {
        if (0 < (int)uVar1) {
          uVar16 = 0;
          pfVar11 = pfVar10;
          pfVar24 = pfVar7;
          do {
            uVar13 = 0;
            do {
              pfVar11[uVar13] = pfVar24[uVar13] + pfVar11[uVar13];
              uVar13 = uVar13 + 1;
            } while (uVar8 != uVar13);
            uVar16 = uVar16 + 1;
            pfVar24 = pfVar24 + uVar8;
            pfVar11 = pfVar11 + uVar8;
          } while (uVar16 != uVar8);
        }
        uVar6 = uVar6 + uVar20;
        pfVar10 = pfVar10 + uVar20;
      } while (uVar6 < (ulong)((long)local_298.super_vector<float,_std::allocator<float>_>.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                               (long)local_298.super_vector<float,_std::allocator<float>_>.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_start >> 2));
    }
  }
  else {
    lVar22 = (long)this->windowSize * 2 + -1;
    iVar15 = (int)lVar22;
    if (uVar20 != (uint)(iVar15 * iVar15)) {
      __assert_fail("posEmbedding->size() == (2 * windowSize - 1) * (2 * windowSize - 1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dianhsu[P]swin-transformer-cpp/model/window_attention.h"
                    ,0x80,
                    "virtual void shift_window_transformer::WindowAttention<float>::forward(const Tensor<T> &, Tensor<T> &) [T = float]"
                   );
    }
    if ((long)local_298.super_vector<float,_std::allocator<float>_>.
              super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)local_298.super_vector<float,_std::allocator<float>_>.
              super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
              _M_start != 0) {
      uVar20 = 0;
      local_2d0 = local_298.super_vector<float,_std::allocator<float>_>.
                  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                  _M_start;
      do {
        if (0 < (int)local_268) {
          piVar9 = (this->relativeIndices->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          iVar15 = 1;
          uVar6 = 0;
          pfVar10 = local_2d0;
          do {
            uVar16 = 0;
            iVar21 = iVar15;
            do {
              pfVar10[uVar16] =
                   pfVar7[(long)piVar9[iVar21] + piVar9[iVar21 + -1] * lVar22] + pfVar10[uVar16];
              uVar16 = uVar16 + 1;
              iVar21 = iVar21 + 2;
            } while (uVar8 != uVar16);
            uVar6 = uVar6 + 1;
            pfVar10 = pfVar10 + local_268;
            iVar15 = iVar15 + uVar1 * 2;
          } while (uVar6 != uVar8);
        }
        uVar20 = uVar20 + (long)(int)(uVar1 * uVar1);
        local_2d0 = local_2d0 + (int)(uVar1 * uVar1);
      } while (uVar20 < (ulong)((long)local_298.super_vector<float,_std::allocator<float>_>.
                                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                                (long)local_298.super_vector<float,_std::allocator<float>_>.
                                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data._M_start >> 2));
    }
  }
  if ((this->shifted == true) &&
     ((long)local_298.super_vector<float,_std::allocator<float>_>.
            super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_298.super_vector<float,_std::allocator<float>_>.
            super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start != 0)) {
    uVar8 = (long)local_298.super_vector<float,_std::allocator<float>_>.
                  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                  _M_finish -
            (long)local_298.super_vector<float,_std::allocator<float>_>.
                  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                  _M_start >> 2;
    iVar15 = *local_298.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar20 = 0;
    iVar21 = local_298.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[1];
    do {
      if (0 < iVar17) {
        uVar1 = local_298.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[2];
        iVar14 = iVar21 - iVar17;
        do {
          if (0 < (int)uVar1) {
            uVar2 = local_298.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[3];
            pTVar4 = this->upperLowerMask;
            lVar22 = 0;
            uVar6 = 0;
            do {
              if (0 < (int)uVar2) {
                pfVar7 = (pTVar4->super_vector<float,_std::allocator<float>_>).
                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start;
                uVar16 = 0;
                do {
                  iVar18 = (int)uVar16 + (int)uVar20 + uVar1 * iVar14 * uVar2 + (int)uVar6 * uVar2;
                  local_298.super_vector<float,_std::allocator<float>_>.
                  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                  _M_start[iVar18] =
                       *(float *)((long)pfVar7 + uVar16 * 4 + lVar22) +
                       local_298.super_vector<float,_std::allocator<float>_>.
                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar18];
                  uVar16 = uVar16 + 1;
                } while (uVar2 != uVar16);
              }
              uVar6 = uVar6 + 1;
              lVar22 = lVar22 + (long)(int)uVar2 * 4;
            } while (uVar6 != uVar1);
          }
          iVar14 = iVar14 + 1;
        } while (iVar14 < iVar21);
      }
      if (iVar17 <= iVar21) {
        uVar1 = local_298.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[2];
        iVar14 = iVar17 + -1;
        do {
          if (0 < (int)uVar1) {
            uVar2 = local_298.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[3];
            pTVar4 = this->leftRightMask;
            lVar22 = 0;
            uVar6 = 0;
            do {
              if (0 < (int)uVar2) {
                pfVar7 = (pTVar4->super_vector<float,_std::allocator<float>_>).
                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start;
                uVar16 = 0;
                do {
                  iVar18 = (int)uVar16 + (int)uVar20 + uVar1 * iVar14 * uVar2 + (int)uVar6 * uVar2;
                  local_298.super_vector<float,_std::allocator<float>_>.
                  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                  _M_start[iVar18] =
                       *(float *)((long)pfVar7 + uVar16 * 4 + lVar22) +
                       local_298.super_vector<float,_std::allocator<float>_>.
                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar18];
                  uVar16 = uVar16 + 1;
                } while (uVar2 != uVar16);
              }
              uVar6 = uVar6 + 1;
              lVar22 = lVar22 + (long)(int)uVar2 * 4;
            } while (uVar6 != uVar1);
          }
          iVar14 = iVar14 + iVar17;
        } while (iVar14 < iVar21);
      }
      uVar20 = uVar20 + (long)(int)(uVar8 / (ulong)(long)iVar15);
    } while (uVar20 < uVar8);
  }
  local_68.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_68.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.super_vector<float,_std::allocator<float>_>.
  super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  SoftMax<float>::forward(&this->softMax,&local_298,&local_68);
  vStack_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  vStack_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_248 = (float *)0x0;
  vStack_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_258 = (void *)0x0;
  iStack_250._M_current = (float *)0x0;
  std::vector<int,_std::allocator<int>_>::operator=(&vStack_240,&local_1f8.shape);
  iVar15 = *local_298.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < local_298.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[1] * iVar15) {
    iVar21 = 0;
    piVar12 = local_298.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      if (0 < piVar12[2]) {
        iVar15 = 0;
        piVar9 = local_1f8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          iVar14 = piVar9[3];
          if (0 < iVar14) {
            iVar18 = 0;
            do {
              local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((ulong)local_108.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
              iVar3 = local_298.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[3];
              if ((long)iVar3 < 1) {
                fVar25 = 0.0;
              }
              else {
                iVar19 = iVar21 * iVar14 * piVar9[2] + iVar18;
                fVar25 = 0.0;
                lVar22 = 0;
                do {
                  fVar25 = fVar25 + local_298.super_vector<float,_std::allocator<float>_>.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start
                                    [(local_298.shape.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start[2] * iVar21 + iVar15)
                                     * iVar3 + lVar22] *
                                    local_1f8.super_vector<float,_std::allocator<float>_>.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_start[iVar19];
                  local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       (pointer)CONCAT44(local_108.super__Vector_base<float,_std::allocator<float>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,fVar25);
                  lVar22 = lVar22 + 1;
                  iVar19 = iVar19 + iVar14;
                } while (iVar3 != lVar22);
              }
              if (iStack_250._M_current == local_248) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)&local_258,iStack_250,
                           (float *)&local_108);
                piVar9 = local_1f8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
              }
              else {
                *iStack_250._M_current = fVar25;
                iStack_250._M_current = iStack_250._M_current + 1;
              }
              iVar18 = iVar18 + 1;
              iVar14 = piVar9[3];
              piVar12 = local_298.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
            } while (iVar18 < iVar14);
          }
          iVar15 = iVar15 + 1;
        } while (iVar15 < piVar12[2]);
        iVar15 = *piVar12;
      }
      iVar21 = iVar21 + 1;
    } while (iVar21 < piVar12[1] * iVar15);
  }
  vStack_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  vStack_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vStack_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::resize
            (&local_108,(long)iStack_250._M_current - (long)local_258 >> 2);
  std::vector<int,_std::allocator<int>_>::operator=(&vStack_f0,&local_98.shape);
  if ((long)iStack_250._M_current - (long)local_258 != 0) {
    lVar22 = (long)iStack_250._M_current - (long)local_258 >> 2;
    iVar15 = this->windowSize;
    iVar21 = this->headDim;
    iVar14 = this->heads;
    uVar8 = 0;
    do {
      uVar20 = (ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff;
      uVar6 = (long)uVar20 / (long)iVar21;
      uVar6 = (ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff;
      uVar16 = (long)uVar6 / (long)iVar15;
      uVar16 = (ulong)(uint)((int)uVar16 >> 0x1f) << 0x20 | uVar16 & 0xffffffff;
      uVar13 = (long)uVar16 / (long)iVar15;
      uVar13 = (ulong)(uint)((int)uVar13 >> 0x1f) << 0x20 | uVar13 & 0xffffffff;
      uVar5 = (long)uVar13 / (long)iVar17;
      uVar5 = (ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff;
      local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[(((int)((long)uVar16 % (long)iVar15) * iVar15 + (int)((long)uVar6 % (long)iVar15) +
                 (int)((long)uVar13 % (long)iVar17) * iVar15 * iVar15 +
                (int)((long)uVar5 % (long)local_25c) * iVar17 * iVar15 * iVar15) * iVar14 +
               (int)((long)uVar5 / (long)local_25c)) * iVar21 + (int)((long)uVar20 % (long)iVar21)]
           = *(float *)((long)local_258 + uVar8 * 4);
      uVar8 = uVar8 + 1;
    } while (lVar22 + (ulong)(lVar22 == 0) != uVar8);
  }
  local_a8 = 0;
  lStack_a0 = 0;
  local_b8 = 0;
  pvStack_b0 = (void *)0x0;
  local_c8 = (void *)0x0;
  uStack_c0 = 0;
  (**(this->outLinear->super_Layer<float>)._vptr_Layer)(this->outLinear,&local_108);
  pTVar4 = local_d8;
  if (this->shifted == true) {
    (*(code *)**(undefined8 **)this->cyclicBackShift)(this->cyclicBackShift,&local_c8,local_d8);
  }
  else {
    pfVar7 = (local_d8->super_vector<float,_std::allocator<float>_>).
             super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if ((local_d8->super_vector<float,_std::allocator<float>_>).
        super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
        != pfVar7) {
      (local_d8->super_vector<float,_std::allocator<float>_>).
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
           pfVar7;
    }
    piVar9 = (local_d8->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((local_d8->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar9) {
      (local_d8->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar9;
    }
    std::vector<float,std::allocator<float>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
              ((vector<float,std::allocator<float>> *)local_d8,pfVar7,local_c8,uStack_c0);
    std::vector<int,std::allocator<int>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((vector<int,std::allocator<int>> *)&pTVar4->shape,
               (pTVar4->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,pvStack_b0,local_a8);
  }
  if (pvStack_b0 != (void *)0x0) {
    operator_delete(pvStack_b0,lStack_a0 - (long)pvStack_b0);
  }
  if (local_c8 != (void *)0x0) {
    operator_delete(local_c8,local_b8 - (long)local_c8);
  }
  if (vStack_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(vStack_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vStack_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (vStack_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(vStack_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vStack_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_240.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_258 != (void *)0x0) {
    operator_delete(local_258,(long)local_248 - (long)local_258);
  }
  if (local_68.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_68.super_vector<float,_std::allocator<float>_>.
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_298.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_298.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_298.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_298.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_298.super_vector<float,_std::allocator<float>_>.
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_298.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1f8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1f8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1f8.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_1f8.super_vector<float,_std::allocator<float>_>.
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f8.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f8.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_198.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_198.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_198.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_198.super_vector<float,_std::allocator<float>_>.
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1c8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1c8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1c8.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_1c8.super_vector<float,_std::allocator<float>_>.
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c8.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c8.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_168.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_168.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_168.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_168.super_vector<float,_std::allocator<float>_>.
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_138.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_138.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_138.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_138.super_vector<float,_std::allocator<float>_>.
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_98.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_98.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_98.super_vector<float,_std::allocator<float>_>.
      super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_98.super_vector<float,_std::allocator<float>_>.
                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super_vector<float,_std::allocator<float>_>.
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (pvStack_210 != (void *)0x0) {
    operator_delete(pvStack_210,lStack_200 - (long)pvStack_210);
  }
  if (local_228 != (void *)0x0) {
    operator_delete(local_228,local_218 - (long)local_228);
  }
  return;
}

Assistant:

void forward(const Tensor<T> &input, Tensor<T> &output) {
            Tensor<T> tmp{};
            if (shifted) {
                cyclicShift->forward(input, tmp);
            } else {
                tmp.insert(tmp.end(), input.begin(), input.end());
                tmp.shape.insert(tmp.shape.end(), input.shape.begin(), input.shape.end());
            }
            Tensor<T> qTmp{};
            Tensor<T> kTmp{};
            Tensor<T> vTmp{};
            qLinear->forward(tmp, qTmp);
            kLinear->forward(tmp, kTmp);
            kLinear->forward(tmp, vTmp);
            Tensor<T> q{}, k{}, v{};
            int nw_h = qTmp.shape[0] / windowSize, nw_w = qTmp.shape[1] / windowSize;
            reArrange(qTmp, q);
            reArrange(kTmp, k);
            reArrange(vTmp, v);
            Tensor<T> dots{};
            int matX = q.shape[q.shape.size() - 2];
            int matY = q.shape[q.shape.size() - 1];
            dots.shape = q.shape;
            dots.shape[dots.shape.size() - 1] = dots.shape[dots.shape.size() - 2];
            for (int pos = 0; pos < q.size(); pos += matX * matY) {
                for (int pi = 0; pi < matX; ++pi) {
                    for (int pj = 0; pj < matX; ++pj) {
                        T val = 0;
                        for (int pk = 0; pk < matY; ++pk) {
                            val += q[pos + pi * matY + pk] * k[pos + pj * matY + pk];
                        }
                        dots.push_back(val);
                    }
                }
            }

            if (relativePosEmbedding) {
                assert(posEmbedding->size() == (2 * windowSize - 1) * (2 * windowSize - 1));
                for (int pos = 0; pos < dots.size(); pos += matX * matX) {
                    for (int i = 0; i < matX; ++i) {
                        for (int j = 0; j < matX; ++j) {
                            dots[pos + i * matX + j] += (*posEmbedding)[
                                    (*relativeIndices)[i * matX * 2 + j * 2] * (2 * windowSize - 1) +
                                    (*relativeIndices)[i * matX * 2 + j * 2 + 1]];
                        }
                    }
                }
            } else {
                assert(posEmbedding->size() == matX * matX);
                for (int pos = 0; pos < dots.size(); pos += matX * matX) {
                    for (int i = 0; i < matX; ++i) {
                        for (int j = 0; j < matX; ++j) {
                            dots[pos + i * matX + j] += (*posEmbedding)[i * matX + j];
                        }
                    }
                }
            }

            if (shifted) {
                int batch = dots.size() / dots.shape[0];
                for (int pos = 0; pos < dots.size(); pos += batch) {
                    for (int pi = dots.shape[1] - nw_w; pi < dots.shape[1]; ++pi) {
                        for (int pj = 0; pj < dots.shape[2]; ++pj) {
                            for (int pk = 0; pk < dots.shape[3]; ++pk) {
                                dots[pos + pi * dots.shape[2] * dots.shape[3] + pj * dots.shape[3] +
                                     pk] += (*upperLowerMask)[pj * dots.shape[3] + pk];
                            }
                        }
                    }
                    for (int pi = nw_w - 1; pi < dots.shape[1]; pi += nw_w) {
                        for (int pj = 0; pj < dots.shape[2]; ++pj) {
                            for (int pk = 0; pk < dots.shape[3]; ++pk) {
                                dots[pos + pi * dots.shape[2] * dots.shape[3] + pj * dots.shape[3] +
                                     pk] += (*leftRightMask)[pj * dots.shape[3] + pk];
                            }
                        }
                    }
                }
            }
            Tensor<T> attn{};
            softMax.forward(dots, attn);
            Tensor<T> tmp2{};
            tmp2.shape = v.shape;
            for (int pos = 0; pos < dots.shape[0] * dots.shape[1]; ++pos) {
                for (int pi = 0; pi < dots.shape[2]; ++pi) {
                    for (int pj = 0; pj < v.shape[3]; ++pj) {
                        T val = 0;
                        for (int pk = 0; pk < dots.shape[3]; ++pk) {
                            val += dots[pos * dots.shape[2] * dots.shape[3] + pi * dots.shape[3] + pk] *
                                   v[pos * v.shape[2] * v.shape[3] + pk * v.shape[3] + pj];
                        }
                        tmp2.push_back(val);
                    }
                }
            }
            Tensor<T> tmp3{};
            tmp3.resize(tmp2.size());
            tmp3.shape = qTmp.shape;
            for (int i = 0; i < tmp2.size(); ++i) {
                int d = i % headDim;
                int w_w = i / headDim % windowSize;
                int w_h = i / headDim / windowSize % windowSize;
                int mw_w = i / headDim / windowSize / windowSize % nw_w;
                int mw_h = i / headDim / windowSize / windowSize / nw_w % nw_h;
                int h = i / headDim / windowSize / windowSize / nw_w / nw_h;
                int new_pos = d + h * headDim +
                              w_w * headDim * heads +
                              w_h * windowSize * headDim * heads +
                              mw_w * windowSize * windowSize * headDim * heads +
                              mw_h * nw_w * windowSize * windowSize * headDim * heads;
                tmp3[new_pos] = tmp2[i];
            }
            Tensor<T> tmp4{};
            outLinear->forward(tmp3, tmp4);

            if (shifted) {
                cyclicBackShift->forward(tmp4, output);
            } else {
                output.clear();
                output.shape.clear();
                output.insert(output.end(), tmp4.begin(), tmp4.end());
                output.shape.insert(output.shape.end(), tmp4.shape.begin(), tmp4.shape.end());
            }
        }